

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O0

RC __thiscall PF_BufferMgr::UnpinPage(PF_BufferMgr *this,int fd,PageNum pageNum)

{
  short sVar1;
  int local_28;
  RC local_24;
  int slot;
  RC rc;
  PageNum pageNum_local;
  int fd_local;
  PF_BufferMgr *this_local;
  
  slot = pageNum;
  rc = fd;
  _pageNum_local = this;
  local_24 = PF_HashTable::Find(&this->hashTable,fd,pageNum,&local_28);
  if (local_24 == 0) {
    if (this->bufTable[local_28].pinCount == 0) {
      this_local._4_4_ = 7;
    }
    else {
      sVar1 = this->bufTable[local_28].pinCount + -1;
      this->bufTable[local_28].pinCount = sVar1;
      if ((sVar1 == 0) &&
         ((local_24 = Unlink(this,local_28), local_24 != 0 ||
          (local_24 = LinkHead(this,local_28), local_24 != 0)))) {
        this_local._4_4_ = local_24;
      }
      else {
        this_local._4_4_ = 0;
      }
    }
  }
  else {
    this_local._4_4_ = local_24;
    if (local_24 == -8) {
      this_local._4_4_ = 2;
    }
  }
  return this_local._4_4_;
}

Assistant:

RC PF_BufferMgr::UnpinPage(int fd, PageNum pageNum)
{
   RC  rc;       // return code
   int slot;     // buffer slot where page is located

   // The page must be found and pinned in the buffer
   if ((rc = hashTable.Find(fd, pageNum, slot))){
      if ((rc == PF_HASHNOTFOUND))
         return (PF_PAGENOTINBUF);
      else
         return (rc);              // unexpected error
   }

   if (bufTable[slot].pinCount == 0)
      return (PF_PAGEUNPINNED);

#ifdef PF_LOG
   char psMessage[100];
   sprintf (psMessage, "Unpinning (%d,%d). %d Pin count\n",
         fd, pageNum, bufTable[slot].pinCount-1);
   WriteLog(psMessage);
#endif

   // If unpinning the last pin, make it the most recently used page
   if (--(bufTable[slot].pinCount) == 0) {
      if ((rc = Unlink(slot)) ||
            (rc = LinkHead (slot)))
         return (rc);
   }

   // Return ok
   return (0);
}